

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::AddIncludeFlags
          (cmNinjaTargetGenerator *this,string *languageFlags,string *language)

{
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  bool forceFullPaths;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  char local_6a [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string includeFlags;
  
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  psVar3 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)pcVar2,&includes,pcVar1,language,psVar3,true);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  forceFullPaths = std::operator==(language,"RC");
  psVar3 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeFlags
            (&includeFlags,(cmLocalGenerator *)pcVar2,&includes,pcVar1,language,forceFullPaths,false
             ,psVar3);
  pcVar4 = GetGlobalGenerator(this);
  if (pcVar4->UsingGCCOnWindows == true) {
    local_6a[1] = 0x5c;
    local_6a[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )includeFlags._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(includeFlags._M_dataplus._M_p + includeFlags._M_string_length),local_6a + 1,
               local_6a);
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[6])(this->LocalGenerator,languageFlags,&includeFlags);
  std::__cxx11::string::~string((string *)&includeFlags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  return;
}

Assistant:

void cmNinjaTargetGenerator::AddIncludeFlags(std::string& languageFlags,
                                             std::string const& language)
{
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              language, this->GetConfigName());
  // Add include directory flags.
  std::string includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, language,
    language == "RC", // full include paths for RC needed by cmcldeps
    false, this->GetConfigName());
  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    std::replace(includeFlags.begin(), includeFlags.end(), '\\', '/');
  }

  this->LocalGenerator->AppendFlags(languageFlags, includeFlags);
}